

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

Integer pnga_sprs_array_create_from_dense(Integer g_a,Integer idx_size,Integer trans)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  Integer IVar4;
  Integer g_a_00;
  Integer IVar5;
  logical lVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  Integer hi [2];
  Integer lo [2];
  int _val;
  void *vptr;
  Integer ld;
  int local_b8;
  undefined4 uStack_b4;
  long local_b0;
  int local_a8;
  undefined4 uStack_a4;
  int local_a0;
  undefined4 uStack_9c;
  Integer local_90;
  Integer local_88;
  Integer local_80;
  undefined8 local_78;
  double dStack_70;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  Integer local_38;
  
  lVar12 = g_a + 1000;
  lVar11 = (long)GA[lVar12].p_handle;
  local_90 = idx_size;
  local_80 = trans;
  local_58 = g_a;
  IVar5 = pnga_pgroup_nodeid(lVar11);
  iVar15 = GA[lVar12].type;
  local_50 = (long)_ga_sync_begin;
  local_48 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (local_50 != 0) {
    pnga_pgroup_sync(lVar11);
  }
  local_40 = lVar11;
  if (GA[lVar12].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array must be of dimension 2",0);
  }
  IVar4 = local_90;
  local_88 = pnga_sprs_array_create
                       (GA[lVar12].dims[local_80 != 0],GA[lVar12].dims[local_80 == 0],(long)iVar15,
                        local_90);
  g_a_00 = local_58;
  pnga_distribution(local_58,(long)(int)IVar5,(Integer *)&local_a8,(Integer *)&local_b8);
  pnga_access_ptr(g_a_00,(Integer *)&local_a8,(Integer *)&local_b8,&local_60,&local_38);
  if (IVar4 == 4) {
    switch(iVar15 + -0x3e9) {
    case 0:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = (CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1 << 0x20;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar11 << 0x20) + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_90;
            do {
              iVar15 = *(int *)(local_60 +
                               (CONCAT44(uStack_a4,local_a8) * -0x100000000 + lVar13 >> 0x1e));
              local_78 = (double)CONCAT44(local_78._4_4_,iVar15);
              if ((lVar12 == lVar11) || (iVar15 != 0)) {
                lVar10 = lVar12;
                lVar14 = lVar11;
                if (local_80 == 0) {
                  lVar10 = lVar11;
                  lVar14 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar10 + -1,lVar14 + -1,&local_78);
              }
              lVar13 = lVar13 + 0x100000000;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 1:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = (CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1 << 0x20;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar11 << 0x20) + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_a4,local_a8) * -0x100000000 + lVar13 >> 0x1d)
                          );
              if ((lVar12 == lVar11) || (local_78 != 0.0)) {
                lVar10 = lVar12;
                lVar14 = lVar11;
                if (local_80 == 0) {
                  lVar10 = lVar11;
                  lVar14 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar10 + -1,lVar14 + -1,&local_78);
              }
              lVar13 = lVar13 + 0x100000000;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 2:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_58 = (CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1 << 0x20;
        local_90 = local_60;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar11 << 0x20) + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_58;
            do {
              fVar16 = *(float *)(local_60 +
                                 (CONCAT44(uStack_a4,local_a8) * -0x100000000 + lVar13 >> 0x1e));
              local_78 = (double)CONCAT44(local_78._4_4_,fVar16);
              if (((lVar12 == lVar11) || (fVar16 != 0.0)) || (NAN(fVar16))) {
                lVar10 = lVar12;
                lVar14 = lVar11;
                if (local_80 == 0) {
                  lVar10 = lVar11;
                  lVar14 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar10 + -1,lVar14 + -1,&local_78);
                local_60 = local_90;
              }
              lVar13 = lVar13 + 0x100000000;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 3:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = (CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1 << 0x20;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar11 << 0x20) + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_a4,local_a8) * -0x100000000 + lVar13 >> 0x1d)
                          );
              if (((lVar12 == lVar11) || (local_78 != 0.0)) || (NAN(local_78))) {
                lVar10 = lVar12;
                lVar14 = lVar11;
                if (local_80 == 0) {
                  lVar10 = lVar11;
                  lVar14 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar10 + -1,lVar14 + -1,&local_78);
              }
              lVar13 = lVar13 + 0x100000000;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    default:
switchD_00149024_caseD_4:
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype encountered",(long)iVar15);
      break;
    case 5:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = CONCAT44(local_90._4_4_,((local_b8 - local_a8) + 1) * 2);
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            iVar15 = ((int)lVar12 - local_a0) * (int)local_90 + local_a8 * 2;
            lVar11 = CONCAT44(uStack_a4,local_a8);
            do {
              iVar7 = iVar15 + local_a8 * -2;
              fVar16 = *(float *)(local_60 + (long)iVar7 * 4);
              fVar1 = *(float *)(local_60 + (long)(iVar7 + 1) * 4);
              local_78 = (double)CONCAT44(fVar1,fVar16);
              if (((lVar12 == lVar11) || (fVar16 != 0.0)) ||
                 ((NAN(fVar16) || ((fVar1 != 0.0 || (NAN(fVar1))))))) {
                lVar14 = lVar12;
                lVar13 = lVar11;
                if (local_80 == 0) {
                  lVar14 = lVar11;
                  lVar13 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar14 + -1,lVar13 + -1,&local_78);
              }
              iVar15 = iVar15 + 2;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 6:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = CONCAT44(local_90._4_4_,((local_b8 - local_a8) + 1) * 2);
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            iVar15 = ((int)lVar12 - local_a0) * (int)local_90 + local_a8 * 2;
            lVar11 = CONCAT44(uStack_a4,local_a8);
            do {
              iVar7 = iVar15 + local_a8 * -2;
              local_78 = *(double *)(local_60 + (long)iVar7 * 8);
              dStack_70 = *(double *)(local_60 + (long)(iVar7 + 1) * 8);
              if ((((lVar12 == lVar11) || (local_78 != 0.0)) || (NAN(local_78))) ||
                 ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
                lVar14 = lVar12;
                lVar13 = lVar11;
                if (local_80 == 0) {
                  lVar14 = lVar11;
                  lVar13 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar14 + -1,lVar13 + -1,&local_78);
              }
              iVar15 = iVar15 + 2;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 0xf:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = (CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1 << 0x20;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar11 << 0x20) + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_a4,local_a8) * -0x100000000 + lVar13 >> 0x1d)
                          );
              if ((lVar12 == lVar11) || (local_78 != 0.0)) {
                lVar10 = lVar12;
                lVar14 = lVar11;
                if (local_80 == 0) {
                  lVar10 = lVar11;
                  lVar14 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar10 + -1,lVar14 + -1,&local_78);
              }
              lVar13 = lVar13 + 0x100000000;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
    }
  }
  else {
    switch(iVar15 + -0x3e9) {
    case 0:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        lVar12 = CONCAT44(uStack_b4,local_b8);
        lVar11 = CONCAT44(uStack_a4,local_a8);
        lVar13 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar14 = CONCAT44(uStack_9c,local_a0);
            lVar10 = CONCAT44(uStack_a4,local_a8);
            do {
              iVar15 = *(int *)((lVar13 - lVar14) * ((lVar12 - lVar11) + 1) * 4 + local_60 +
                                CONCAT44(uStack_a4,local_a8) * -4 + lVar10 * 4);
              local_78 = (double)CONCAT44(local_78._4_4_,iVar15);
              if ((lVar13 == lVar10) || (iVar15 != 0)) {
                lVar9 = lVar13;
                lVar3 = lVar10;
                if (local_80 == 0) {
                  lVar9 = lVar10;
                  lVar3 = lVar13;
                }
                pnga_sprs_array_add_element(local_88,lVar9 + -1,lVar3 + -1,&local_78);
              }
              bVar2 = lVar10 < CONCAT44(uStack_b4,local_b8);
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
          bVar2 = lVar13 < local_b0;
          lVar13 = lVar13 + 1;
        } while (bVar2);
      }
      break;
    case 1:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        lVar12 = CONCAT44(uStack_b4,local_b8);
        lVar11 = CONCAT44(uStack_a4,local_a8);
        lVar13 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar14 = CONCAT44(uStack_9c,local_a0);
            lVar10 = CONCAT44(uStack_a4,local_a8);
            do {
              local_78 = *(double *)
                          ((lVar13 - lVar14) * ((lVar12 - lVar11) + 1) * 8 + local_60 +
                           CONCAT44(uStack_a4,local_a8) * -8 + lVar10 * 8);
              if ((lVar13 == lVar10) || (local_78 != 0.0)) {
                lVar9 = lVar10;
                lVar3 = lVar13;
                if (local_80 == 0) {
                  lVar9 = lVar13;
                  lVar3 = lVar10;
                }
                pnga_sprs_array_add_element(local_88,lVar3 + -1,lVar9 + -1,&local_78);
              }
              bVar2 = lVar10 < CONCAT44(uStack_b4,local_b8);
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
          bVar2 = lVar13 < local_b0;
          lVar13 = lVar13 + 1;
        } while (bVar2);
      }
      break;
    case 2:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        lVar12 = CONCAT44(uStack_b4,local_b8);
        lVar11 = CONCAT44(uStack_a4,local_a8);
        lVar13 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar14 = CONCAT44(uStack_9c,local_a0);
            lVar10 = CONCAT44(uStack_a4,local_a8);
            do {
              fVar16 = *(float *)((lVar13 - lVar14) * ((lVar12 - lVar11) + 1) * 4 + local_60 +
                                  CONCAT44(uStack_a4,local_a8) * -4 + lVar10 * 4);
              local_78 = (double)CONCAT44(local_78._4_4_,fVar16);
              if (((lVar13 == lVar10) || (fVar16 != 0.0)) || (NAN(fVar16))) {
                lVar9 = lVar10;
                lVar3 = lVar13;
                if (local_80 == 0) {
                  lVar9 = lVar13;
                  lVar3 = lVar10;
                }
                pnga_sprs_array_add_element(local_88,lVar3 + -1,lVar9 + -1,&local_78);
              }
              bVar2 = lVar10 < CONCAT44(uStack_b4,local_b8);
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
          bVar2 = lVar13 < local_b0;
          lVar13 = lVar13 + 1;
        } while (bVar2);
      }
      break;
    case 3:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        lVar12 = CONCAT44(uStack_b4,local_b8);
        lVar11 = CONCAT44(uStack_a4,local_a8);
        lVar13 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar14 = CONCAT44(uStack_9c,local_a0);
            lVar10 = CONCAT44(uStack_a4,local_a8);
            do {
              local_78 = *(double *)
                          ((lVar13 - lVar14) * ((lVar12 - lVar11) + 1) * 8 + local_60 +
                           CONCAT44(uStack_a4,local_a8) * -8 + lVar10 * 8);
              if (((lVar13 == lVar10) || (local_78 != 0.0)) || (NAN(local_78))) {
                lVar9 = lVar10;
                lVar3 = lVar13;
                if (local_80 == 0) {
                  lVar9 = lVar13;
                  lVar3 = lVar10;
                }
                pnga_sprs_array_add_element(local_88,lVar3 + -1,lVar9 + -1,&local_78);
              }
              bVar2 = lVar10 < CONCAT44(uStack_b4,local_b8);
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
          bVar2 = lVar13 < local_b0;
          lVar13 = lVar13 + 1;
        } while (bVar2);
      }
      break;
    default:
      goto switchD_00149024_caseD_4;
    case 5:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = local_60;
        local_58 = ((CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1) * 8;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_58 + local_90;
            lVar11 = CONCAT44(uStack_a4,local_a8);
            do {
              local_78 = *(double *)(lVar13 + CONCAT44(uStack_a4,local_a8) * -8 + lVar11 * 8);
              fVar16 = (float)((ulong)local_78 >> 0x20);
              if (((lVar12 == lVar11) || (SUB84(local_78,0) != 0.0)) ||
                 ((NAN(SUB84(local_78,0)) || ((fVar16 != 0.0 || (NAN(fVar16))))))) {
                lVar10 = lVar11;
                lVar14 = lVar12;
                if (local_80 == 0) {
                  lVar10 = lVar12;
                  lVar14 = lVar11;
                }
                pnga_sprs_array_add_element(local_88,lVar14 + -1,lVar10 + -1,&local_78);
              }
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 6:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        local_90 = local_60;
        local_58 = ((CONCAT44(uStack_b4,local_b8) - CONCAT44(uStack_a4,local_a8)) + 1) * 0x10;
        lVar12 = CONCAT44(uStack_9c,local_a0);
        do {
          lVar11 = CONCAT44(uStack_a4,local_a8);
          if (lVar11 <= CONCAT44(uStack_b4,local_b8)) {
            lVar13 = lVar11 * 0x10 + local_90 + (lVar12 - CONCAT44(uStack_9c,local_a0)) * local_58;
            do {
              pdVar8 = (double *)(lVar13 + CONCAT44(uStack_a4,local_a8) * -0x10);
              local_78 = *pdVar8;
              dStack_70 = pdVar8[1];
              if ((((lVar12 == lVar11) || (local_78 != 0.0)) || (NAN(local_78))) ||
                 ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
                lVar10 = lVar11;
                lVar14 = lVar12;
                if (local_80 == 0) {
                  lVar10 = lVar12;
                  lVar14 = lVar11;
                }
                pnga_sprs_array_add_element(local_88,lVar14 + -1,lVar10 + -1,&local_78);
              }
              lVar13 = lVar13 + 0x10;
              bVar2 = lVar11 < CONCAT44(uStack_b4,local_b8);
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar12 < local_b0;
          lVar12 = lVar12 + 1;
        } while (bVar2);
      }
      break;
    case 0xf:
      if (CONCAT44(uStack_9c,local_a0) <= local_b0) {
        lVar12 = CONCAT44(uStack_b4,local_b8);
        lVar11 = CONCAT44(uStack_a4,local_a8);
        lVar13 = CONCAT44(uStack_9c,local_a0);
        do {
          if (CONCAT44(uStack_a4,local_a8) <= CONCAT44(uStack_b4,local_b8)) {
            lVar14 = CONCAT44(uStack_9c,local_a0);
            lVar10 = CONCAT44(uStack_a4,local_a8);
            do {
              local_78 = *(double *)
                          ((lVar13 - lVar14) * ((lVar12 - lVar11) + 1) * 8 + local_60 +
                           CONCAT44(uStack_a4,local_a8) * -8 + lVar10 * 8);
              if ((lVar13 == lVar10) || (local_78 != 0.0)) {
                lVar9 = lVar10;
                lVar3 = lVar13;
                if (local_80 == 0) {
                  lVar9 = lVar13;
                  lVar3 = lVar10;
                }
                pnga_sprs_array_add_element(local_88,lVar3 + -1,lVar9 + -1,&local_78);
              }
              bVar2 = lVar10 < CONCAT44(uStack_b4,local_b8);
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
          bVar2 = lVar13 < local_b0;
          lVar13 = lVar13 + 1;
        } while (bVar2);
      }
    }
  }
  lVar12 = local_48;
  pnga_mask_sync(local_50,local_48);
  lVar6 = pnga_sprs_array_assemble(local_88);
  lVar11 = local_40;
  if (lVar6 == 0) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create sparse array from dense array",0)
    ;
  }
  if ((int)lVar12 != 0) {
    pnga_pgroup_sync(lVar11);
  }
  return local_88;
}

Assistant:

Integer pnga_sprs_array_create_from_dense(Integer g_a, Integer idx_size,
    Integer trans)
{
  Integer handle = g_a + GA_OFFSET, s_a;
  int local_sync_begin,local_sync_end;
  Integer i, j, idx, jdx, lo[2], hi[2], ld;
  Integer idim, jdim;
  int grp = GA[handle].p_handle;
  int me = (int)pnga_pgroup_nodeid(grp);
  void *vptr;
  int type = GA[handle].type;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* Check dimension */
  if (GA[handle].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array"
        " must be of dimension 2",0);
  }
  if (trans) {
    idim = (Integer)GA[handle].dims[1];
    jdim = (Integer)GA[handle].dims[0];
  } else {
    idim = (Integer)GA[handle].dims[0];
    jdim = (Integer)GA[handle].dims[1];
  }

  /* create sparse array */
  s_a = pnga_sprs_array_create(idim, jdim, type, idx_size);
  /* find bounding indices of locally owned block from global array */
  pnga_distribution(g_a,me,lo,hi);
  /* get pointer to locally owned block */
  pnga_access_ptr(g_a, lo, hi, &vptr, &ld);
  /* add all non-zero entries from g_a to s_a. Add diagonal elements
   * to s_a even if they are zero */
  if (idx_size == 4) {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  } else {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int64_t,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int64_t,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int64_t,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int64_t,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int64_t,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_sprs_array_assemble(s_a)) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create"
        " sparse array from dense array",0);
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_a;
}